

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pig.cpp
# Opt level: O1

bool __thiscall Pig::getUntilWS(Pig *this,string *result)

{
  ulong uVar1;
  bool bVar2;
  uint c;
  element_type *peVar3;
  ulong uVar4;
  long *local_48 [2];
  long local_38 [2];
  
  uVar1 = this->_cursor;
  uVar4 = uVar1;
  while( true ) {
    c = utf8_next_char((this->_text).
                       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,&this->_cursor);
    if (c == 0) {
      return uVar1 < this->_cursor;
    }
    bVar2 = unicodeWhitespace(c);
    if (bVar2) break;
    peVar3 = (this->_text).
             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    uVar4 = this->_cursor;
    if ((peVar3->_M_dataplus)._M_p[uVar4] == '\0') {
LAB_00112c3e:
      std::__cxx11::string::substr((ulong)local_48,(ulong)peVar3);
      std::__cxx11::string::operator=((string *)result,(string *)local_48);
      if (local_48[0] != local_38) {
        operator_delete(local_48[0],local_38[0] + 1);
      }
      return true;
    }
  }
  this->_cursor = uVar4;
  peVar3 = (this->_text).
           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  goto LAB_00112c3e;
}

Assistant:

bool Pig::getUntilWS (std::string& result)
{
  auto save = _cursor;

  int c;
  auto prev = _cursor;
  while ((c = utf8_next_char (*_text, _cursor)))
  {
    if (unicodeWhitespace (c))
    {
      _cursor = prev;
      result = _text->substr (save, _cursor - save);
      return true;
    }

    // Note: This test must follow the above unicodeWhitespace(c) test because
    //       it is testing the value of 'c', and eos() is testing _cursor,
    //       which has already been advanced.
    else if (eos ())
    {
      result = _text->substr (save, _cursor - save);
      return true;
    }

    prev = _cursor;
  }

  return _cursor > save;
}